

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ps_static.cxx
# Opt level: O1

void __thiscall xray_re::xr_level_ps_static::save(xr_level_ps_static *this,xr_writer *w)

{
  pointer pppVar1;
  particle_data *ppVar2;
  undefined8 in_RAX;
  uint32_t id;
  pointer pppVar3;
  bool bVar4;
  undefined8 uStack_38;
  
  bVar4 = this->m_version != 0;
  uStack_38 = in_RAX;
  if (bVar4) {
    xr_writer::w_raw_chunk(w,0,&this->m_version,4,false);
  }
  id = (uint32_t)bVar4;
  pppVar1 = (this->m_particles).
            super__Vector_base<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (pppVar3 = (this->m_particles).
                 super__Vector_base<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; pppVar3 != pppVar1;
      pppVar3 = pppVar3 + 1) {
    ppVar2 = *pppVar3;
    xr_writer::open_chunk(w,id);
    if (this->m_version != 0) {
      uStack_38 = CONCAT26(ppVar2->extra,(undefined6)uStack_38);
      (*w->_vptr_xr_writer[2])(w,(long)&uStack_38 + 6,2);
    }
    xr_writer::w_sz(w,&ppVar2->reference);
    (*w->_vptr_xr_writer[2])(w,&ppVar2->xform,0x40);
    xr_writer::close_chunk(w);
    id = id + 1;
  }
  return;
}

Assistant:

void xr_level_ps_static::save(xr_writer& w) const
{
	uint32_t id;
	if (m_version == PS_VERSION_0) {
		id = 0;
	} else {
		id = 1;
		w.w_chunk(PS_CHUNK_VERSION, m_version);
	}
	for (particle_data_vec_cit it = m_particles.begin(), end = m_particles.end();
			it != end; ++it, ++id) {
		const particle_data* particle = *it;
		w.open_chunk(id);
		if (m_version != PS_VERSION_0)
			w.w_u16(particle->extra);
		w.w_sz(particle->reference);
		w.w(particle->xform);
		w.close_chunk();
	}
}